

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_multistring.c
# Opt level: O0

uchar * ares_dns_multistring_get(ares_dns_multistring_t *strs,size_t idx,size_t *len)

{
  undefined8 *puVar1;
  multistring_data_t *data;
  size_t *len_local;
  size_t idx_local;
  ares_dns_multistring_t *strs_local;
  
  if ((strs == (ares_dns_multistring_t *)0x0) || (len == (size_t *)0x0)) {
    strs_local = (ares_dns_multistring_t *)0x0;
  }
  else {
    puVar1 = (undefined8 *)ares_array_at_const(strs->strs,idx);
    if (puVar1 == (undefined8 *)0x0) {
      strs_local = (ares_dns_multistring_t *)0x0;
    }
    else {
      *len = puVar1[1];
      strs_local = (ares_dns_multistring_t *)*puVar1;
    }
  }
  return (uchar *)strs_local;
}

Assistant:

const unsigned char *
  ares_dns_multistring_get(const ares_dns_multistring_t *strs, size_t idx,
                           size_t *len)
{
  const multistring_data_t *data;

  if (strs == NULL || len == NULL) {
    return NULL;
  }

  data = ares_array_at_const(strs->strs, idx);
  if (data == NULL) {
    return NULL;
  }

  *len = data->len;
  return data->data;
}